

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall
kws::Parser::IsBetweenCharsFast
          (Parser *this,char begin,char end,size_t pos,bool withComments,string *buffer)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  string stream;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)buffer);
  if ((buffer->_M_string_length == 0) && (std::__cxx11::string::_M_assign(local_50), withComments))
  {
    std::__cxx11::string::_M_assign(local_50);
  }
  if (pos == 0xffffffffffffffff) {
    bVar1 = false;
  }
  else {
    do {
      uVar2 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)begin);
      uVar3 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)end);
      bVar1 = uVar2 < uVar3 && uVar3 != 0xffffffffffffffff;
      if (uVar3 <= uVar2 || uVar3 == 0xffffffffffffffff) break;
    } while (uVar3 <= pos || pos <= uVar2);
  }
  std::__cxx11::string::~string(local_50);
  return bVar1;
}

Assistant:

bool Parser::IsBetweenCharsFast(const char begin, const char end ,size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  size_t b0 = stream.find(begin,0);
  size_t b1 = stream.find(end,b0);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(begin,b0+1);
    b1 = stream.find(end,b0);
    }
  return false;
}